

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O2

RealType __thiscall
OpenMD::BoxObjectiveFunction::valueAndGradient
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  int iVar2;
  int j;
  long lVar3;
  RealType RVar4;
  
  (*this->info_->sman_->_vptr_SnapshotManager[2])();
  iVar2 = setCoor(this,x);
  if (iVar2 != 0) {
    pdVar1 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = INFINITY;
    }
    return INFINITY;
  }
  Shake::constraintR(this->shake_);
  (*this->forceMan_->_vptr_ForceManager[2])();
  if (this->hasFlucQ_ == true) {
    FluctuatingChargeConstraints::applyConstraints(this->fqConstraints_);
  }
  Shake::constraintF(this->shake_);
  getGrad(this,grad);
  RVar4 = Thermo::getPotential(&this->thermo);
  return RVar4;
}

Assistant:

RealType BoxObjectiveFunction::valueAndGradient(
      DynamicVector<RealType>& grad, const DynamicVector<RealType>& x) {
    info_->getSnapshotManager()->advance();
    if (setCoor(x) == 0) {
      shake_->constraintR();
      forceMan_->calcForces();
      if (hasFlucQ_) fqConstraints_->applyConstraints();
      shake_->constraintF();
      getGrad(grad);
      return thermo.getPotential();
    } else {
      // The deformation was too large, so return infinite
      // potential and gradient
      for (int j = 0; j < 6; j++)
        grad[j] = std::numeric_limits<RealType>::infinity();
      return std::numeric_limits<RealType>::infinity();
    }
  }